

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::MethodOptions::InternalSerializeWithCachedSizesToArray
          (MethodOptions *this,uint8 *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  int32 value;
  int iVar3;
  UninterpretedOption *this_00;
  void *pvVar4;
  uint8 *target_00;
  int iVar5;
  uint8 *local_38;
  
  uVar2 = (this->_has_bits_).has_bits_[0];
  local_38 = target;
  if ((uVar2 & 1) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    bVar1 = this->deprecated_;
    local_38[0] = 0x88;
    local_38[1] = '\x02';
    local_38 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_38 + 2);
  }
  if ((uVar2 & 2) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    value = this->idempotency_level_;
    local_38[0] = 0x90;
    local_38[1] = '\x02';
    local_38 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(value,local_38 + 2);
  }
  iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar5 = 0; iVar3 != iVar5; iVar5 = iVar5 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    this_00 = (UninterpretedOption *)
              ((this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_)->elements[iVar5];
    local_38[0] = 0xba;
    local_38[1] = '>';
    target_00 = io::CodedOutputStream::WriteVarint32ToArray
                          ((this_00->_cached_size_).size_.super___atomic_base<int>._M_i,local_38 + 2
                          );
    local_38 = UninterpretedOption::InternalSerializeWithCachedSizesToArray
                         (this_00,target_00,stream);
  }
  local_38 = internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
                       (&this->_extensions_,1000,0x20000000,local_38,stream);
  pvVar4 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar4 & 1) != 0) {
    local_38 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                         ((UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe),local_38,stream);
  }
  return local_38;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* MethodOptions::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.MethodOptions)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional bool deprecated = 33 [default = false];
  if (cached_has_bits & 0x00000001u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(33, this->_internal_deprecated(), target);
  }

  // optional .google.protobuf.MethodOptions.IdempotencyLevel idempotency_level = 34 [default = IDEMPOTENCY_UNKNOWN];
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      34, this->_internal_idempotency_level(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_uninterpreted_option_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(999, this->_internal_uninterpreted_option(i), target, stream);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.InternalSerializeWithCachedSizesToArray(
      1000, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.MethodOptions)
  return target;
}